

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O3

bool mjs::is_assignment_op(token_type t)

{
  return (bool)((byte)(0x3fe001a0 >> ((byte)t & 0x1f)) & t < gt);
}

Assistant:

bool is_assignment_op(token_type t) {
    switch (t) {
    case token_type::equal:
    case token_type::plusequal:
    case token_type::minusequal:
    case token_type::multiplyequal:
    case token_type::divideequal:
    case token_type::modequal:
    case token_type::lshiftequal:
    case token_type::rshiftequal:
    case token_type::rshiftshiftequal:
    case token_type::andequal:
    case token_type::orequal:
    case token_type::xorequal:
        return true;
    default:
        return false;
    }
}